

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_cte_node.cpp
# Opt level: O1

bool __thiscall duckdb::RecursiveCTENode::Equals(RecursiveCTENode *this,QueryNode *other_p)

{
  bool bVar1;
  int iVar2;
  RecursiveCTENode *pRVar3;
  pointer pQVar4;
  undefined8 extraout_RDX;
  
  bVar1 = QueryNode::Equals(&this->super_QueryNode,other_p);
  if (bVar1) {
    if (this == (RecursiveCTENode *)other_p) {
      return true;
    }
    pRVar3 = QueryNode::Cast<duckdb::RecursiveCTENode>(other_p);
    if ((pRVar3->union_all == this->union_all) &&
       (bVar1 = ParsedExpression::ListEquals(&this->key_targets,&pRVar3->key_targets), bVar1)) {
      pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&this->left);
      iVar2 = (*pQVar4->_vptr_QueryNode[4])
                        (pQVar4,(pRVar3->left).
                                super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
      if ((char)iVar2 != '\0') {
        pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                 operator->(&this->right);
        iVar2 = (*pQVar4->_vptr_QueryNode[4])
                          (pQVar4,(pRVar3->right).
                                  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                  .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl,
                           extraout_RDX,pQVar4->_vptr_QueryNode[4]);
        return SUB41(iVar2,0);
      }
    }
  }
  return false;
}

Assistant:

bool RecursiveCTENode::Equals(const QueryNode *other_p) const {
	if (!QueryNode::Equals(other_p)) {
		return false;
	}
	if (this == other_p) {
		return true;
	}
	auto &other = other_p->Cast<RecursiveCTENode>();

	if (other.union_all != union_all) {
		return false;
	}

	if (!ParsedExpression::ListEquals(key_targets, other.key_targets)) {
		return false;
	}

	if (!left->Equals(other.left.get())) {
		return false;
	}
	if (!right->Equals(other.right.get())) {
		return false;
	}
	return true;
}